

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lua-seri.c
# Opt level: O0

void * rb_read(read_block *rb,int sz)

{
  int iVar1;
  int ptr;
  int sz_local;
  read_block *rb_local;
  
  if (rb->len < sz) {
    rb_local = (read_block *)0x0;
  }
  else {
    iVar1 = rb->ptr;
    rb->ptr = sz + rb->ptr;
    rb->len = rb->len - sz;
    rb_local = (read_block *)(rb->buffer + iVar1);
  }
  return rb_local;
}

Assistant:

static void *
rb_read(struct read_block *rb, int sz) {
	if (rb->len < sz) {
		return NULL;
	}

	int ptr = rb->ptr;
	rb->ptr += sz;
	rb->len -= sz;
	return rb->buffer + ptr;
}